

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall
helics::CommonCore::routeMessage(CommonCore *this,ActionMessage *cmd,GlobalFederateId dest)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  FederateStates FVar3;
  _func_int *UNRECOVERED_JUMPTABLE;
  FederateState *this_00;
  uint *puVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  ulong uVar7;
  optional<helics::ActionMessage> rep;
  optional<helics::ActionMessage> oStack_e8;
  
  if ((dest.gid == -2010000000) || (dest.gid == -1700000000)) {
    return;
  }
  (cmd->dest_id).gid = dest.gid;
  if ((dest.gid == 0) || ((this->super_BrokerBase).higher_broker_id.gid == dest.gid)) {
    UNRECOVERED_JUMPTABLE = (this->super_Core)._vptr_Core[0x6b];
    uVar7 = 0;
  }
  else {
    if ((this->super_BrokerBase).global_broker_id_local.gid == dest.gid) {
      processCommandsForCore(this,cmd);
      return;
    }
    if ((cmd->dest_id).gid == (this->filterFedID)._M_i.gid) {
      FilterFederate::handleMessage(this->filterFed,cmd);
      return;
    }
    if ((this->translatorFedID)._M_i.gid == dest.gid) {
      TranslatorFederate::handleMessage(this->translatorFed,cmd);
      return;
    }
    bVar2 = isLocal(this,dest);
    if (bVar2) {
      this_00 = getFederateCore(this,dest);
      if (this_00 == (FederateState *)0x0) {
        return;
      }
      FVar3 = FederateState::getState(this_00);
      if (FVar3 == FINISHED) {
        FederateState::processPostTerminationAction(&oStack_e8,this_00,cmd);
        if (oStack_e8.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
            super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
            super__Optional_payload_base<helics::ActionMessage>._M_engaged == true) {
          routeMessage(this,(ActionMessage *)&oStack_e8);
        }
        if ((oStack_e8.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
             super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
             super__Optional_payload_base<helics::ActionMessage>._M_engaged & 1U) == 0) {
          return;
        }
        oStack_e8.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
        super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
        super__Optional_payload_base<helics::ActionMessage>._M_engaged = false;
        ActionMessage::~ActionMessage((ActionMessage *)&oStack_e8);
        return;
      }
      FederateState::addAction(this_00,cmd);
      return;
    }
    p_Var6 = (this->routing_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    puVar4 = &parent_route_id;
    if (p_Var6 != (_Base_ptr)0x0) {
      p_Var1 = &(this->routing_table)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = &p_Var1->_M_header;
      do {
        if (dest.gid <= (int)p_Var6[1]._M_color) {
          p_Var5 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < dest.gid];
      } while (p_Var6 != (_Base_ptr)0x0);
      if ((_Rb_tree_header *)p_Var5 != p_Var1) {
        puVar4 = &parent_route_id;
        if ((int)p_Var5[1]._M_color <= dest.gid) {
          puVar4 = (uint *)&p_Var5[1].field_0x4;
        }
      }
    }
    uVar7 = (ulong)*puVar4;
    UNRECOVERED_JUMPTABLE = (this->super_Core)._vptr_Core[0x6b];
  }
  (*UNRECOVERED_JUMPTABLE)(this,uVar7,cmd);
  return;
}

Assistant:

void CommonCore::routeMessage(ActionMessage&& cmd, GlobalFederateId dest)
{
    if (!dest.isValid()) {
        return;
    }
    cmd.dest_id = dest;
    if ((dest == parent_broker_id) || (dest == higher_broker_id)) {
        transmit(parent_route_id, cmd);
    } else if (cmd.dest_id == global_broker_id_local) {
        processCommandsForCore(cmd);
    } else if (cmd.dest_id == filterFedID) {
        filterFed->handleMessage(cmd);
    } else if (dest == translatorFedID) {
        translatorFed->handleMessage(cmd);
    } else if (isLocal(dest)) {
        auto* fed = getFederateCore(dest);
        if (fed != nullptr) {
            if (fed->getState() != FederateStates::FINISHED) {
                fed->addAction(std::move(cmd));
            } else {
                auto rep = fed->processPostTerminationAction(cmd);
                if (rep) {
                    routeMessage(*rep);
                }
            }
        }
    } else {
        auto route = getRoute(dest);
        transmit(route, cmd);
    }
}